

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::anon_unknown_24::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  byte bVar1;
  FieldDescriptor *field;
  ushort *puVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool v1;
  int iVar5;
  Nonnull<const_char_*> failure_msg;
  int iVar6;
  int iVar7;
  CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  CVar8;
  AlphaNum *in_R8;
  Metadata MVar9;
  string fieldval;
  string name;
  string tmp;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_1a0;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_180;
  SizeType<std::allocator<absl::lts_20250127::LogSink_*>_> local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_160;
  char *local_158;
  char *local_150;
  undefined1 local_148 [32];
  string local_128;
  undefined1 local_108 [32];
  pointer local_e8;
  Metadata local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [40];
  bool *local_a8 [4];
  bool *local_88 [5];
  AlphaNum local_60;
  
  local_160 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(option_entries,
                    (option_entries->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  MVar9 = Message::GetMetadata(options);
  local_108._24_8_ = MVar9.reflection;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  Reflection::ListFields
            ((Reflection *)local_108._24_8_,options,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_108);
  local_e8 = (pointer)local_108._8_8_;
  if (local_108._0_8_ != local_108._8_8_) {
    local_d8 = (undefined1  [8])(long)(depth * 2);
    CVar8.super_Storage<unsigned_long,_1UL,_false>.value =
         (Storage<unsigned_long,_1UL,_false>)(Storage<unsigned_long,_1UL,_false>)local_108._0_8_;
    do {
      field = *(FieldDescriptor **)CVar8.super_Storage<unsigned_long,_1UL,_false>.value;
      bVar1 = field->field_0x1;
      v1 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 != v1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (v1,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_d0);
      }
      iVar5 = 1;
      local_e0.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
      .super_Storage<unsigned_long,_1UL,_false>.value =
           (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            )(CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
              )CVar8.super_Storage<unsigned_long,_1UL,_false>.value;
      if (((bVar1 & 0x20) == 0) ||
         (iVar5 = Reflection::FieldSize((Reflection *)local_108._24_8_,options,field), 0 < iVar5)) {
        iVar7 = 0;
        do {
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          local_1a0._M_string_length = 0;
          local_1a0.field_2._M_local_buf[0] = '\0';
          if ((field->type_ & 0xfe) == 10) {
            local_158 = local_148;
            local_150 = (char *)0x0;
            local_148[0] = kInfo;
            TextFormat::Printer::Printer((Printer *)local_d0);
            local_d0[0x12] = true;
            local_d0._0_4_ = depth + 1;
            iVar6 = -1;
            if ((bVar1 & 0x20) != 0) {
              iVar6 = iVar7;
            }
            TextFormat::Printer::PrintFieldValueToString
                      ((Printer *)local_d0,options,field,iVar6,(string *)&local_158);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_158);
            in_R8 = (AlphaNum *)0x20;
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_1a0,local_1a0._M_string_length,0,local_d8[0]);
            std::__cxx11::string::append((char *)&local_1a0);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
            ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                               *)local_88);
            local_88[0] = (bool *)0xffffffffffffff9d;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
            ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                               *)local_a8);
            local_a8[0] = (bool *)0xffffffffffffff9d;
            if ((_Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 )local_d0._32_8_ != (FastFieldValuePrinter *)0x0) {
              (*(*(_func_int ***)local_d0._32_8_)[1])();
            }
            if (local_158 != local_148) {
              operator_delete(local_158,CONCAT71(local_148._1_7_,local_148[0]) + 1);
            }
          }
          else {
            iVar6 = -1;
            if ((bVar1 & 0x20) != 0) {
              iVar6 = iVar7;
            }
            TextFormat::PrintFieldValueToString(options,field,iVar6,&local_1a0);
          }
          local_180._M_head_impl = (LogMessageData *)&local_170;
          local_178 = 0;
          local_170 = 0;
          if ((field->field_0x1 & 8) == 0) {
            puVar2 = (ushort *)(field->all_names_).payload_;
            local_d0._0_8_ = local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,(long)puVar2 + ~(ulong)*puVar2,(long)puVar2 + -1);
            std::__cxx11::string::operator=((string *)&local_180,(string *)local_d0);
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,
                              CONCAT53(local_d0._19_5_,CONCAT12(local_d0[0x12],local_d0._16_2_)) + 1
                             );
            }
          }
          else {
            local_d0._0_8_ = 2;
            local_d0._8_8_ = "(.";
            local_150 = (field->all_names_).payload_;
            local_158 = (char *)(ulong)*(ushort *)(local_150 + 2);
            local_150 = local_150 + ~(ulong)local_158;
            local_60.piece_._M_len = 1;
            local_60.piece_._M_str = ")";
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_128,(lts_20250127 *)local_d0,(AlphaNum *)&local_158,&local_60,in_R8);
            std::__cxx11::string::operator=((string *)&local_180,(string *)&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_d0._0_8_ = local_178;
          local_d0._8_8_ = local_180._M_head_impl;
          local_158 = (char *)0x3;
          local_150 = " = ";
          local_60.piece_._M_len = local_1a0._M_string_length;
          local_60.piece_._M_str = local_1a0._M_dataplus._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_128,(lts_20250127 *)local_d0,(AlphaNum *)&local_158,&local_60,in_R8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_160,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_180._M_head_impl != (LogMessageData *)&local_170) {
            operator_delete(local_180._M_head_impl,CONCAT71(uStack_16f,local_170) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,
                            CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                     local_1a0.field_2._M_local_buf[0]) + 1);
          }
          iVar7 = iVar7 + 1;
        } while (iVar5 != iVar7);
      }
      CVar8.super_Storage<unsigned_long,_1UL,_false>.value =
           (Storage<unsigned_long,_1UL,_false>)
           ((long)local_e0.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                  .super_Storage<unsigned_long,_1UL,_false>.value + 8);
    } while (CVar8.super_Storage<unsigned_long,_1UL,_false>.value !=
             (Storage<unsigned_long,_1UL,_false>)local_e8);
  }
  pbVar3 = *(pointer *)local_160;
  pbVar4 = *(pointer *)(local_160 + 8);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  return pbVar3 != pbVar4;
}

Assistant:

bool RetrieveOptionsAssumingRightPool(
    int depth, const Message& options,
    std::vector<std::string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (const FieldDescriptor* field : fields) {
    int count = 1;
    bool repeated = false;
    if (field->is_repeated()) {
      count = reflection->FieldSize(options, field);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      std::string fieldval;
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        std::string tmp;
        TextFormat::Printer printer;
        printer.SetExpandAny(true);
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, field, repeated ? j : -1,
                                        &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, field, repeated ? j : -1,
                                            &fieldval);
      }
      std::string name;
      if (field->is_extension()) {
        name = absl::StrCat("(.", field->full_name(), ")");
      } else {
        name = std::string(field->name());
      }
      option_entries->push_back(absl::StrCat(name, " = ", fieldval));
    }
  }
  return !option_entries->empty();
}